

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          char *exception_string)

{
  char *exception_type_local;
  char *expr_local;
  int line_local;
  char *file_local;
  Enum at_local;
  ResultBuilder *this_local;
  
  AssertData::AssertData(&this->super_AssertData);
  (this->super_AssertData).m_test_case = *(TestCaseData **)(g_cs + 0x28);
  (this->super_AssertData).m_at = at;
  (this->super_AssertData).m_file = file;
  (this->super_AssertData).m_line = line;
  (this->super_AssertData).m_expr = expr;
  (this->super_AssertData).m_failed = true;
  (this->super_AssertData).m_threw = false;
  (this->super_AssertData).m_threw_as = false;
  (this->super_AssertData).m_exception_type = exception_type;
  (this->super_AssertData).m_exception_string = exception_string;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
                                 const char* exception_type, const char* exception_string) {
        m_test_case        = g_cs->currentTest;
        m_at               = at;
        m_file             = file;
        m_line             = line;
        m_expr             = expr;
        m_failed           = true;
        m_threw            = false;
        m_threw_as         = false;
        m_exception_type   = exception_type;
        m_exception_string = exception_string;
#if DOCTEST_MSVC
        if(m_expr[0] == ' ') // this happens when variadic macros are disabled under MSVC
            ++m_expr;
#endif // MSVC
    }